

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O0

void __thiscall xercesc_4_0::ICUTransService::lowerCase(ICUTransService *this,XMLCh *toLowerCase)

{
  XMLCh *toLowerCase_local;
  ICUTransService *this_local;
  
  doCaseConvert<int(*)(int)>(toLowerCase,u_tolower_70);
  return;
}

Assistant:

void ICUTransService::lowerCase(XMLCh* const toLowerCase)
{
    doCaseConvert(toLowerCase, u_tolower);
}